

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

uint __thiscall BMP::read_u32(BMP *this,FILE *fp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar b3;
  uchar b2;
  uchar b1;
  uchar b0;
  FILE *fp_local;
  BMP *this_local;
  
  iVar1 = getc((FILE *)fp);
  iVar2 = getc((FILE *)fp);
  iVar3 = getc((FILE *)fp);
  iVar4 = getc((FILE *)fp);
  return CONCAT31(CONCAT21(CONCAT11((char)iVar4,(char)iVar3),(char)iVar2),(char)iVar1);
}

Assistant:

unsigned int BMP::read_u32( FILE *fp )
{
    unsigned char b0, b1, b2, b3;

    b0 = ( unsigned char )getc( fp );
    b1 = ( unsigned char )getc( fp );
    b2 = ( unsigned char )getc( fp );
    b3 = ( unsigned char )getc( fp );

    return ( ( ( ( ( ( b3 << 8 ) | b2 ) << 8 ) | b1 ) << 8 ) | b0 );
}